

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conc_heter_queue.h
# Opt level: O2

reentrant_put_transaction<density_tests::TestObject<256UL,_128UL>_> * __thiscall
density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
start_reentrant_emplace<density_tests::TestObject<256ul,128ul>,density_tests::TestObject<256ul,128ul>>
          (reentrant_put_transaction<density_tests::TestObject<256UL,_128UL>_>
           *__return_storage_ptr__,
          conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *this,
          TestObject<256UL,_128UL> *i_construction_params)

{
  conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
  *pcVar1;
  reentrant_put_transaction<density_tests::TestObject<256UL,_128UL>_> local_68;
  reentrant_put_transaction<density_tests::TestObject<256UL,_128UL>_> local_40;
  
  std::mutex::lock((mutex *)this);
  heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  start_reentrant_emplace<density_tests::TestObject<256ul,128ul>,density_tests::TestObject<256ul,128ul>>
            ((reentrant_put_transaction<density_tests::TestObject<256UL,_128UL>_> *)&local_68,
             (heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *)
             (this + 0x28),i_construction_params);
  pcVar1 = local_68.m_queue;
  local_40.m_put_data.m_control_block = (ControlBlock *)local_68.m_put_transaction.m_queue;
  local_40.m_put_data.m_user_storage = local_68.m_put_transaction.m_put_data.m_control_block;
  local_68.m_queue =
       (conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
        *)0x0;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<density_tests::TestObject<256UL,_128UL>_>::~reentrant_put_transaction
            ((reentrant_put_transaction<density_tests::TestObject<256UL,_128UL>_> *)&local_68);
  local_40.m_queue =
       (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
       0x0;
  local_68.m_put_transaction.m_put_data.m_control_block = local_40.m_put_data.m_control_block;
  local_68.m_put_transaction.m_put_data.m_user_storage = local_40.m_put_data.m_user_storage;
  __return_storage_ptr__->m_queue =
       (conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
        *)this;
  (__return_storage_ptr__->m_put_transaction).m_queue =
       (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
       pcVar1;
  (__return_storage_ptr__->m_put_transaction).m_put_data.m_control_block =
       local_40.m_put_data.m_control_block;
  (__return_storage_ptr__->m_put_transaction).m_put_data.m_user_storage =
       local_40.m_put_data.m_user_storage;
  local_68.m_queue =
       (conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
        *)0x0;
  local_68.m_put_transaction.m_queue =
       (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
       0x0;
  conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<density_tests::TestObject<256UL,_128UL>_>::~reentrant_put_transaction
            (&local_68);
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<density_tests::TestObject<256UL,_128UL>_>::~reentrant_put_transaction
            (&local_40);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return __return_storage_ptr__;
}

Assistant:

reentrant_put_transaction<ELEMENT_TYPE>
          start_reentrant_emplace(CONSTRUCTION_PARAMS &&... i_construction_params)
        {
            std::lock_guard<std::mutex> lock(m_mutex);
            auto put_transaction = m_queue.template start_reentrant_emplace<ELEMENT_TYPE>(
              std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...);
            return reentrant_put_transaction<ELEMENT_TYPE>(
              PrivateType(), this, std::move(put_transaction));
        }